

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_quantize_avx.c
# Opt level: O0

void aom_quantize_b_avx(tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr
                       ,int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
                       tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
                       int16_t *iscan)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m128i shift_00;
  __m128i shift_01;
  __m128i shift_02;
  __m128i shift_03;
  __m128i zero_00;
  __m128i zero_01;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  undefined1 auVar4 [32];
  int16_t iVar5;
  int16_t *in_RCX;
  __m128i *round_00;
  long lVar6;
  int16_t *in_RDX;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_03;
  long in_RSI;
  __m128i *zbin_00;
  tran_low_t *in_RDI;
  __m128i *coeff0_00;
  tran_low_t *in_R8;
  int16_t *in_R9;
  __m128i *quant_00;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined8 uVar10;
  undefined1 auVar9 [64];
  __m128i alVar11;
  __m128i quant_01;
  __m128i quant_02;
  __m128i quant_03;
  __m128i quant_04;
  __m128i round_01;
  __m128i round_02;
  __m128i round_03;
  __m128i qcoeff;
  __m128i qcoeff_00;
  __m128i qcoeff_01;
  __m128i qcoeff_02;
  __m128i eob_00;
  __m128i dequant_00;
  __m128i dequant_01;
  __m128i zbin_mask0;
  __m128i dequant_02;
  __m128i dequant_03;
  __m128i zbin_mask0_00;
  __m128i zbin_mask1;
  __m128i zbin_mask1_00;
  undefined8 *in_stack_00000008;
  __m128i eob;
  __m128i all_zero;
  __m128i cmp_mask1;
  __m128i cmp_mask0;
  __m128i qcoeff1;
  __m128i qcoeff0;
  __m128i coeff1;
  __m128i coeff0;
  __m128i shift;
  __m128i dequant;
  __m128i quant;
  __m128i round;
  __m128i zbin;
  int index;
  __m256i big_zero;
  __m128i zero;
  __m128i *dequant_04;
  __m128i *shift_04;
  tran_low_t *in_stack_fffffffffffff8c0;
  longlong in_stack_fffffffffffff8c8;
  longlong in_stack_fffffffffffff8d0;
  undefined1 local_720 [16];
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  longlong local_6f0;
  undefined8 uStack_6e8;
  __m128i local_6e0;
  __m128i local_6d0;
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  __m128i local_6a0;
  __m128i local_690;
  __m128i local_680;
  __m128i local_670;
  __m128i local_660;
  int local_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_610;
  undefined8 uStack_608;
  long local_5e0;
  tran_low_t *local_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [32];
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  longlong local_560;
  longlong lStack_558;
  longlong local_550;
  longlong lStack_548;
  longlong local_540;
  longlong lStack_538;
  longlong local_530;
  longlong lStack_528;
  longlong local_520;
  longlong lStack_518;
  longlong local_510;
  longlong lStack_508;
  longlong local_500;
  longlong lStack_4f8;
  longlong local_4f0;
  longlong lStack_4e8;
  longlong local_4e0;
  longlong lStack_4d8;
  longlong local_4d0;
  longlong lStack_4c8;
  longlong local_4c0;
  longlong lStack_4b8;
  longlong local_4b0;
  longlong lStack_4a8;
  longlong local_4a0;
  longlong lStack_498;
  longlong local_490;
  longlong lStack_488;
  longlong local_480;
  longlong lStack_478;
  longlong local_470;
  longlong lStack_468;
  longlong local_460;
  longlong lStack_458;
  longlong local_450;
  longlong lStack_448;
  longlong local_440;
  longlong lStack_438;
  longlong local_430;
  longlong lStack_428;
  longlong local_420;
  longlong lStack_418;
  longlong local_410;
  longlong lStack_408;
  longlong local_400;
  longlong lStack_3f8;
  longlong local_3f0;
  longlong lStack_3e8;
  longlong local_3e0;
  longlong lStack_3d8;
  longlong local_3d0;
  longlong lStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  longlong local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 (*local_308) [32];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 *local_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  tran_low_t *local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 *local_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  tran_low_t *local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 *local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  tran_low_t *local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 *local_158;
  undefined8 local_150;
  undefined8 uStack_148;
  longlong local_140;
  longlong lStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  longlong local_120;
  longlong lStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  longlong local_100;
  longlong lStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  longlong local_e0;
  longlong lStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  longlong local_c0;
  longlong lStack_b8;
  longlong local_b0;
  undefined8 uStack_a8;
  longlong local_a0;
  longlong lStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  longlong local_80;
  longlong lStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  longlong local_60;
  longlong lStack_58;
  longlong local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_04;
  
  local_5d0 = 0;
  uStack_5c8 = 0;
  local_610 = 0;
  uStack_608 = 0;
  local_5c0._8_8_ = SUB328(ZEXT832(0),4);
  local_640 = 0;
  uStack_638 = local_5c0._8_8_;
  uStack_630 = 0;
  uStack_628 = 0;
  uVar7 = 0;
  uVar10 = 0;
  local_720 = ZEXT816(0);
  *dequant_ptr = 0;
  shift_04 = &local_6a0;
  dequant_04 = &local_690;
  zbin_00 = &local_660;
  round_00 = &local_670;
  quant_00 = &local_680;
  local_5e0 = in_RSI;
  local_5d8 = in_RDI;
  local_5c0 = ZEXT832(0) << 0x20;
  load_b_values(in_RDX,zbin_00,in_RCX,round_00,(int16_t *)in_R8,quant_00,(int16_t *)dqcoeff_ptr,
                dequant_04,in_R9,shift_04);
  load_tran_low(local_5d8);
  local_6b0._8_8_ = uVar10;
  local_6b0._0_8_ = uVar7;
  coeff0_00 = (__m128i *)(local_5d8 + 8);
  alVar11 = load_tran_low((tran_low_t *)coeff0_00);
  local_6c0._8_8_ = uVar10;
  local_6c0._0_8_ = uVar7;
  local_570 = local_6b0._0_8_;
  uStack_568 = local_6b0._8_8_;
  local_6d0 = (__m128i)vpabsw_avx(local_6b0);
  auVar1._8_8_ = uVar10;
  auVar1._0_8_ = uVar7;
  local_6e0 = (__m128i)vpabsw_avx(auVar1);
  local_4f0 = local_6d0[0];
  lStack_4e8 = local_6d0[1];
  local_500 = local_660[0];
  lStack_4f8 = local_660[1];
  auVar1 = vpcmpgtw_avx((undefined1  [16])local_6d0,(undefined1  [16])local_660);
  local_3d0 = local_660[0];
  lStack_3c8 = local_660[1];
  local_3e0 = local_660[0];
  lStack_3d8 = local_660[1];
  local_660 = (__m128i)vpunpckhqdq_avx((undefined1  [16])local_660,(undefined1  [16])local_660);
  local_510 = local_6e0[0];
  lStack_508 = local_6e0[1];
  local_520 = local_660[0];
  lStack_518 = local_660[1];
  auVar2 = vpcmpgtw_avx((undefined1  [16])local_6e0,(undefined1  [16])local_660);
  local_6f0 = auVar1._0_8_;
  uStack_6e8 = auVar1._8_8_;
  local_700 = auVar2._0_8_;
  uStack_6f8 = auVar2._8_8_;
  local_390 = local_6f0;
  uStack_388 = uStack_6e8;
  local_3a0 = local_700;
  uStack_398 = uStack_6f8;
  auVar3 = vpor_avx(auVar1,auVar2);
  local_710 = auVar3._0_8_;
  uStack_708 = auVar3._8_8_;
  local_350 = local_710;
  uStack_348 = uStack_708;
  local_360 = local_710;
  uStack_358 = uStack_708;
  local_580 = uVar7;
  uStack_578 = uVar10;
  if (auVar3 == (undefined1  [16])0x0) {
    local_158 = in_stack_00000008;
    local_180 = local_640;
    uStack_178 = uStack_638;
    uStack_170 = uStack_630;
    uStack_168 = uStack_628;
    *in_stack_00000008 = local_640;
    in_stack_00000008[1] = uStack_638;
    in_stack_00000008[2] = uStack_630;
    in_stack_00000008[3] = uStack_628;
    local_188 = qcoeff_ptr;
    local_1c0 = local_640;
    uStack_1b8 = uStack_638;
    uStack_1b0 = uStack_630;
    uStack_1a8 = uStack_628;
    *(undefined8 *)qcoeff_ptr = local_640;
    *(undefined8 *)(qcoeff_ptr + 2) = uStack_638;
    *(undefined8 *)(qcoeff_ptr + 4) = uStack_630;
    *(undefined8 *)(qcoeff_ptr + 6) = uStack_628;
    local_1c8 = in_stack_00000008 + 4;
    local_200 = local_640;
    uStack_1f8 = uStack_638;
    uStack_1f0 = uStack_630;
    uStack_1e8 = uStack_628;
    *local_1c8 = local_640;
    in_stack_00000008[5] = uStack_638;
    in_stack_00000008[6] = uStack_630;
    in_stack_00000008[7] = uStack_628;
    local_208 = qcoeff_ptr + 8;
    local_240 = local_640;
    uStack_238 = uStack_638;
    uStack_230 = uStack_630;
    uStack_228 = uStack_628;
    *(undefined8 *)local_208 = local_640;
    *(undefined8 *)(qcoeff_ptr + 10) = uStack_638;
    *(undefined8 *)(qcoeff_ptr + 0xc) = uStack_630;
    *(undefined8 *)(qcoeff_ptr + 0xe) = uStack_628;
    if (local_5e0 == 0x10) {
      return;
    }
    local_3f0 = local_670[0];
    lStack_3e8 = local_670[1];
    local_400 = local_670[0];
    lStack_3f8 = local_670[1];
    local_670 = (__m128i)vpunpckhqdq_avx((undefined1  [16])local_670,(undefined1  [16])local_670);
    local_410 = local_680[0];
    lStack_408 = local_680[1];
    local_420 = local_680[0];
    lStack_418 = local_680[1];
    local_680 = (__m128i)vpunpckhqdq_avx((undefined1  [16])local_680,(undefined1  [16])local_680);
    local_430 = local_6a0[0];
    lStack_428 = local_6a0[1];
    local_440 = local_6a0[0];
    lStack_438 = local_6a0[1];
    local_6a0 = (__m128i)vpunpckhqdq_avx((undefined1  [16])local_6a0,(undefined1  [16])local_6a0);
    local_450 = local_690[0];
    lStack_448 = local_690[1];
    local_460 = local_690[0];
    lStack_458 = local_690[1];
    local_690 = (__m128i)vpunpckhqdq_avx((undefined1  [16])local_690,(undefined1  [16])local_690);
    auVar9 = ZEXT1664((undefined1  [16])local_690);
  }
  else {
    shift_00[1]._0_4_ = (int)dequant_04;
    shift_00[0] = (longlong)dqcoeff_ptr;
    shift_00[1]._4_4_ = (int)((ulong)dequant_04 >> 0x20);
    quant_01[1] = (longlong)in_R8;
    quant_01[0] = (longlong)round_00;
    alVar11[0] = (longlong)zbin_00;
    calculate_qcoeff(&local_6d0,alVar11,quant_01,shift_00);
    local_470 = local_670[0];
    lStack_468 = local_670[1];
    local_480 = local_670[0];
    lStack_478 = local_670[1];
    local_670 = (__m128i)vpunpckhqdq_avx((undefined1  [16])local_670,(undefined1  [16])local_670);
    local_490 = local_680[0];
    lStack_488 = local_680[1];
    local_4a0 = local_680[0];
    lStack_498 = local_680[1];
    local_680 = (__m128i)vpunpckhqdq_avx((undefined1  [16])local_680,(undefined1  [16])local_680);
    local_4b0 = local_6a0[0];
    lStack_4a8 = local_6a0[1];
    local_4c0 = local_6a0[0];
    lStack_4b8 = local_6a0[1];
    local_6a0 = (__m128i)vpunpckhqdq_avx((undefined1  [16])local_6a0,(undefined1  [16])local_6a0);
    shift_01[1]._0_4_ = (int)dequant_04;
    shift_01[0] = (longlong)dqcoeff_ptr;
    shift_01[1]._4_4_ = (int)((ulong)dequant_04 >> 0x20);
    quant_02[1] = (longlong)in_R8;
    quant_02[0] = (longlong)round_00;
    round_01[1] = extraout_RDX;
    round_01[0] = (longlong)zbin_00;
    calculate_qcoeff(&local_6e0,round_01,quant_02,shift_01);
    local_e0 = local_6d0[0];
    lStack_d8 = local_6d0[1];
    local_f0 = local_6b0._0_8_;
    uStack_e8 = local_6b0._8_8_;
    auVar3 = vpsignw_avx((undefined1  [16])local_6d0,local_6b0);
    local_100 = local_6e0[0];
    lStack_f8 = local_6e0[1];
    local_110 = local_6c0._0_8_;
    uStack_108 = local_6c0._8_8_;
    auVar8 = vpsignw_avx((undefined1  [16])local_6e0,local_6c0);
    local_6d0[0] = auVar3._0_8_;
    local_6d0[1] = auVar3._8_8_;
    local_60 = local_6d0[0];
    lStack_58 = local_6d0[1];
    local_70 = local_6f0;
    uStack_68 = uStack_6e8;
    local_6d0 = (__m128i)vpand_avx(auVar3,auVar1);
    local_6e0[0] = auVar8._0_8_;
    local_6e0[1] = auVar8._8_8_;
    local_80 = local_6e0[0];
    lStack_78 = local_6e0[1];
    local_90 = local_700;
    uStack_88 = uStack_6f8;
    local_6e0 = (__m128i)vpand_avx(auVar8,auVar2);
    a[1] = in_stack_fffffffffffff8d0;
    a[0] = in_stack_fffffffffffff8c8;
    store_tran_low(a,in_stack_fffffffffffff8c0);
    a_00[1] = in_stack_fffffffffffff8d0;
    a_00[0] = in_stack_fffffffffffff8c8;
    store_tran_low(a_00,in_stack_fffffffffffff8c0);
    qcoeff[1] = (longlong)zbin_00;
    qcoeff[0] = (longlong)qcoeff_ptr;
    dequant_00[1] = (longlong)round_00;
    dequant_00[0] = extraout_RDX_00;
    calculate_dqcoeff_and_store(qcoeff,dequant_00,in_R8);
    local_4d0 = local_690[0];
    lStack_4c8 = local_690[1];
    local_4e0 = local_690[0];
    lStack_4d8 = local_690[1];
    local_690 = (__m128i)vpunpckhqdq_avx((undefined1  [16])local_690,(undefined1  [16])local_690);
    qcoeff_00[0] = qcoeff_ptr + 8;
    qcoeff_00[1] = (longlong)zbin_00;
    dequant_01[1] = (longlong)round_00;
    dequant_01[0] = extraout_RDX_01;
    calculate_dqcoeff_and_store(qcoeff_00,dequant_01,in_R8);
    auVar9 = ZEXT1664(auVar1);
    coeff0_00 = &local_6d0;
    zbin_00 = &local_6e0;
    zero_00[1] = (longlong)shift_04;
    zero_00[0] = (longlong)in_R9;
    zbin_mask0[1] = 0;
    zbin_mask0[0] = (longlong)scan;
    zbin_mask1[1] = (longlong)quant_00;
    zbin_mask1[0] = (longlong)in_R8;
    scan_for_eob(coeff0_00,zbin_00,zbin_mask0,zbin_mask1,(int16_t *)dqcoeff_ptr,(int)dequant_04,
                 zero_00);
    local_720 = auVar9._0_16_;
  }
  for (local_644 = 0x10; local_644 < local_5e0; local_644 = local_644 + 0x10) {
    auVar8 = auVar9._0_16_;
    load_tran_low(local_5d8 + local_644);
    lVar6 = (long)local_644;
    coeff0_00 = (__m128i *)(local_5d8 + lVar6 + 8);
    local_6b0 = auVar8;
    alVar11 = load_tran_low((tran_low_t *)coeff0_00);
    round_02[1] = alVar11[1];
    local_590 = local_6b0._0_8_;
    uStack_588 = local_6b0._8_8_;
    local_6d0 = (__m128i)vpabsw_avx(local_6b0);
    local_6c0._0_8_ = auVar8._0_8_;
    local_6c0._8_8_ = auVar8._8_8_;
    local_5a0 = local_6c0._0_8_;
    uStack_598 = local_6c0._8_8_;
    local_6e0 = (__m128i)vpabsw_avx(auVar8);
    local_530 = local_6d0[0];
    lStack_528 = local_6d0[1];
    local_540 = local_660[0];
    lStack_538 = local_660[1];
    auVar1 = vpcmpgtw_avx((undefined1  [16])local_6d0,(undefined1  [16])local_660);
    local_550 = local_6e0[0];
    lStack_548 = local_6e0[1];
    local_560 = local_660[0];
    lStack_558 = local_660[1];
    auVar2 = vpcmpgtw_avx((undefined1  [16])local_6e0,(undefined1  [16])local_660);
    local_6f0 = auVar1._0_8_;
    uStack_6e8 = auVar1._8_8_;
    local_700 = auVar2._0_8_;
    uStack_6f8 = auVar2._8_8_;
    local_3b0 = local_6f0;
    uStack_3a8 = uStack_6e8;
    local_3c0 = local_700;
    uStack_3b8 = uStack_6f8;
    auVar3 = vpor_avx(auVar1,auVar2);
    local_710 = auVar3._0_8_;
    uStack_708 = auVar3._8_8_;
    local_370 = local_710;
    uStack_368 = uStack_708;
    local_380 = local_710;
    uStack_378 = uStack_708;
    local_6c0 = auVar8;
    if (auVar3 == (undefined1  [16])0x0) {
      local_248 = (undefined8 *)((long)in_stack_00000008 + (long)local_644 * 4);
      local_280 = local_640;
      uStack_278 = uStack_638;
      uStack_270 = uStack_630;
      uStack_268 = uStack_628;
      *local_248 = local_640;
      local_248[1] = uStack_638;
      local_248[2] = uStack_630;
      local_248[3] = uStack_628;
      local_288 = qcoeff_ptr + local_644;
      local_2c0 = local_640;
      uStack_2b8 = uStack_638;
      uStack_2b0 = uStack_630;
      uStack_2a8 = uStack_628;
      *(undefined8 *)local_288 = local_640;
      *(undefined8 *)(local_288 + 2) = uStack_638;
      *(undefined8 *)(local_288 + 4) = uStack_630;
      *(undefined8 *)(local_288 + 6) = uStack_628;
      local_2c8 = (undefined8 *)((long)in_stack_00000008 + (long)local_644 * 4 + 0x20);
      local_300 = local_640;
      uStack_2f8 = uStack_638;
      uStack_2f0 = uStack_630;
      uStack_2e8 = uStack_628;
      *local_2c8 = local_640;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_644 * 4 + 0x28) = uStack_638;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_644 * 4 + 0x30) = uStack_630;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_644 * 4 + 0x38) = uStack_628;
      local_308 = (undefined1 (*) [32])(qcoeff_ptr + (long)local_644 + 8);
      local_340 = local_640;
      uStack_338 = uStack_638;
      uStack_330 = uStack_630;
      uStack_328 = uStack_628;
      auVar4._8_8_ = uStack_638;
      auVar4._0_8_ = local_640;
      auVar4._16_8_ = uStack_630;
      auVar4._24_8_ = uStack_628;
      auVar9 = ZEXT3264(auVar4);
      *local_308 = auVar4;
      local_6f0 = in_stack_fffffffffffff8d0;
    }
    else {
      shift_02[1]._0_4_ = (int)dequant_04;
      shift_02[0] = (longlong)dqcoeff_ptr;
      shift_02[1]._4_4_ = (int)((ulong)dequant_04 >> 0x20);
      quant_03[1] = (longlong)in_R8;
      quant_03[0] = lVar6;
      round_02[0] = (longlong)zbin_00;
      calculate_qcoeff(&local_6d0,round_02,quant_03,shift_02);
      shift_03[1]._0_4_ = (int)dequant_04;
      shift_03[0] = (longlong)dqcoeff_ptr;
      shift_03[1]._4_4_ = (int)((ulong)dequant_04 >> 0x20);
      quant_04[1] = (longlong)in_R8;
      quant_04[0] = lVar6;
      round_03[1] = extraout_RDX_02;
      round_03[0] = (longlong)zbin_00;
      calculate_qcoeff(&local_6e0,round_03,quant_04,shift_03);
      local_120 = local_6d0[0];
      lStack_118 = local_6d0[1];
      local_130 = local_6b0._0_8_;
      uStack_128 = local_6b0._8_8_;
      auVar3 = vpsignw_avx((undefined1  [16])local_6d0,local_6b0);
      local_140 = local_6e0[0];
      lStack_138 = local_6e0[1];
      local_150 = local_6c0._0_8_;
      uStack_148 = local_6c0._8_8_;
      auVar8 = vpsignw_avx((undefined1  [16])local_6e0,local_6c0);
      local_6d0[0] = auVar3._0_8_;
      local_6d0[1] = auVar3._8_8_;
      local_a0 = local_6d0[0];
      lStack_98 = local_6d0[1];
      local_b0 = local_6f0;
      uStack_a8 = uStack_6e8;
      local_6d0 = (__m128i)vpand_avx(auVar3,auVar1);
      local_6e0[0] = auVar8._0_8_;
      local_6e0[1] = auVar8._8_8_;
      local_c0 = local_6e0[0];
      lStack_b8 = local_6e0[1];
      local_d0 = local_700;
      uStack_c8 = uStack_6f8;
      local_6e0 = (__m128i)vpand_avx(auVar8,auVar2);
      a_01[1] = in_stack_fffffffffffff8d0;
      a_01[0] = in_stack_fffffffffffff8c8;
      store_tran_low(a_01,in_stack_fffffffffffff8c0);
      a_02[1] = in_stack_fffffffffffff8d0;
      a_02[0] = in_stack_fffffffffffff8c8;
      store_tran_low(a_02,in_stack_fffffffffffff8c0);
      qcoeff_01[0] = qcoeff_ptr + local_644;
      qcoeff_01[1] = (longlong)zbin_00;
      dequant_02[1] = lVar6;
      dequant_02[0] = extraout_RDX_03;
      calculate_dqcoeff_and_store(qcoeff_01,dequant_02,in_R8);
      qcoeff_02[0] = qcoeff_ptr + (long)local_644 + 8;
      qcoeff_02[1] = (longlong)zbin_00;
      dequant_03[1] = lVar6;
      dequant_03[0] = extraout_RDX_04;
      calculate_dqcoeff_and_store(qcoeff_02,dequant_03,in_R8);
      coeff0_00 = &local_6d0;
      zbin_00 = &local_6e0;
      zero_01[1] = (longlong)shift_04;
      zero_01[0] = (longlong)in_R9;
      zbin_mask0_00[1]._0_4_ = local_644;
      zbin_mask0_00[0] = (longlong)scan;
      zbin_mask0_00[1]._4_4_ = 0;
      zbin_mask1_00[1] = (longlong)quant_00;
      zbin_mask1_00[0] = (longlong)in_R8;
      scan_for_eob(coeff0_00,zbin_00,zbin_mask0_00,zbin_mask1_00,(int16_t *)dqcoeff_ptr,
                   (int)dequant_04,zero_01);
      local_40 = local_720._0_8_;
      uStack_38 = local_720._8_8_;
      auVar2._8_8_ = uStack_6e8;
      auVar2._0_8_ = local_6f0;
      local_720 = vpmaxsw_avx(local_720,auVar2);
      auVar9 = ZEXT1664(local_720);
      local_50 = local_6f0;
      uStack_48 = uStack_6e8;
    }
    in_stack_fffffffffffff8d0 = local_6f0;
  }
  eob_00[1] = (longlong)zbin_00;
  eob_00[0] = (longlong)coeff0_00;
  iVar5 = accumulate_eob(eob_00);
  *dequant_ptr = iVar5;
  return;
}

Assistant:

void aom_quantize_b_avx(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                        const int16_t *zbin_ptr, const int16_t *round_ptr,
                        const int16_t *quant_ptr,
                        const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
                        tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr,
                        uint16_t *eob_ptr, const int16_t *scan,
                        const int16_t *iscan) {
  const __m128i zero = _mm_setzero_si128();
  const __m256i big_zero = _mm256_setzero_si256();
  int index;

  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1;
  __m128i all_zero;
  __m128i eob = zero, eob0;

  (void)scan;

  *eob_ptr = 0;

  load_b_values(zbin_ptr, &zbin, round_ptr, &round, quant_ptr, &quant,
                dequant_ptr, &dequant, quant_shift_ptr, &shift);

  // Do DC and first 15 AC.
  coeff0 = load_tran_low(coeff_ptr);
  coeff1 = load_tran_low(coeff_ptr + 8);

  qcoeff0 = _mm_abs_epi16(coeff0);
  qcoeff1 = _mm_abs_epi16(coeff1);

  cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_test_all_zeros(all_zero, all_zero)) {
    _mm256_store_si256((__m256i *)(qcoeff_ptr), big_zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr), big_zero);
    _mm256_store_si256((__m256i *)(qcoeff_ptr + 8), big_zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr + 8), big_zero);

    if (n_coeffs == 16) return;

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    calculate_qcoeff(&qcoeff0, round, quant, shift);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    calculate_qcoeff(&qcoeff1, round, quant, shift);

    // Reinsert signs
    qcoeff0 = _mm_sign_epi16(qcoeff0, coeff0);
    qcoeff1 = _mm_sign_epi16(qcoeff1, coeff1);

    // Mask out zbin threshold coeffs
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_tran_low(qcoeff0, qcoeff_ptr);
    store_tran_low(qcoeff1, qcoeff_ptr + 8);

    calculate_dqcoeff_and_store(qcoeff0, dequant, dqcoeff_ptr);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    calculate_dqcoeff_and_store(qcoeff1, dequant, dqcoeff_ptr + 8);

    eob =
        scan_for_eob(&qcoeff0, &qcoeff1, cmp_mask0, cmp_mask1, iscan, 0, zero);
  }

  // AC only loop.
  for (index = 16; index < n_coeffs; index += 16) {
    coeff0 = load_tran_low(coeff_ptr + index);
    coeff1 = load_tran_low(coeff_ptr + index + 8);

    qcoeff0 = _mm_abs_epi16(coeff0);
    qcoeff1 = _mm_abs_epi16(coeff1);

    cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_test_all_zeros(all_zero, all_zero)) {
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index), big_zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index), big_zero);
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index + 8), big_zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index + 8), big_zero);
      continue;
    }

    calculate_qcoeff(&qcoeff0, round, quant, shift);
    calculate_qcoeff(&qcoeff1, round, quant, shift);

    qcoeff0 = _mm_sign_epi16(qcoeff0, coeff0);
    qcoeff1 = _mm_sign_epi16(qcoeff1, coeff1);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_tran_low(qcoeff0, qcoeff_ptr + index);
    store_tran_low(qcoeff1, qcoeff_ptr + index + 8);

    calculate_dqcoeff_and_store(qcoeff0, dequant, dqcoeff_ptr + index);
    calculate_dqcoeff_and_store(qcoeff1, dequant, dqcoeff_ptr + index + 8);

    eob0 = scan_for_eob(&qcoeff0, &qcoeff1, cmp_mask0, cmp_mask1, iscan, index,
                        zero);
    eob = _mm_max_epi16(eob, eob0);
  }

  *eob_ptr = accumulate_eob(eob);
}